

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict type_spec(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  ushort uVar1;
  short sVar2;
  parse_ctx *ppVar3;
  token_t ptVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  node_t_conflict pnVar7;
  char *pcVar8;
  node_t_conflict op2;
  node_t_conflict pnVar9;
  undefined8 uVar10;
  node_code_t nc;
  int iVar11;
  code *pcVar12;
  parse_ctx_t parse_ctx;
  pos_t p;
  node_t_conflict local_48;
  node_t_conflict local_38;
  
  ppVar3 = c2m_ctx->parse_ctx;
  ptVar4 = ppVar3->curr_token;
  uVar1 = *(ushort *)ptVar4;
  iVar11 = no_err_p;
  if (uVar1 < 0x126) {
    if (uVar1 < 0x114) {
      if (uVar1 != 0x110) {
        if (uVar1 == 0x111) {
          pcVar8 = (ptVar4->pos).fname;
          uVar5._0_4_ = (ptVar4->pos).lno;
          uVar5._4_4_ = (ptVar4->pos).ln_pos;
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          if (ppVar3->record_level != 0) {
            return &err_struct;
          }
          error(c2m_ctx,0x1c1c00,pcVar8,uVar5);
          return &err_struct;
        }
        goto switchD_001977ea_caseD_127;
      }
      pcVar8 = (ptVar4->pos).fname;
      uVar10._0_4_ = (ptVar4->pos).lno;
      uVar10._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_BOOL;
    }
    else {
      if (uVar1 == 0x114) {
        pcVar8 = (ptVar4->pos).fname;
        uVar6._0_4_ = (ptVar4->pos).lno;
        uVar6._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          pnVar7 = type_name(c2m_ctx,no_err_p);
          if (pnVar7 == &err_struct) {
            return &err_struct;
          }
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            error(c2m_ctx,0x1c1c22,pcVar8,uVar6);
            return pnVar7;
          }
          if (ppVar3->record_level != 0) {
            return &err_struct;
          }
          iVar11 = 0x29;
        }
        else {
          if (ppVar3->record_level != 0) {
            return &err_struct;
          }
          iVar11 = 0x28;
        }
        goto LAB_00197cec;
      }
      if (uVar1 == 0x11d) {
        pcVar8 = (ptVar4->pos).fname;
        uVar10._0_4_ = (ptVar4->pos).lno;
        uVar10._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nc = N_CHAR;
      }
      else {
        if (uVar1 != 0x122) goto switchD_001977ea_caseD_127;
        pcVar8 = (ptVar4->pos).fname;
        uVar10._0_4_ = (ptVar4->pos).lno;
        uVar10._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nc = N_DOUBLE;
      }
    }
  }
  else {
    iVar11 = 0x1bc0cc;
    switch(uVar1) {
    case 0x126:
      pcVar8 = (ptVar4->pos).fname;
      uVar10._0_4_ = (ptVar4->pos).lno;
      uVar10._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_FLOAT;
      break;
    case 0x127:
    case 0x128:
    case 0x129:
    case 0x12a:
    case 0x12d:
    case 0x12e:
    case 0x12f:
switchD_001977ea_caseD_127:
      if (uVar1 != 0x134) {
        if (uVar1 != 0x124) {
          if (uVar1 != 0x138) {
            if (arg == (node_t_conflict)0x0) {
              pnVar7 = typedef_name(c2m_ctx,iVar11);
              return pnVar7;
            }
            goto LAB_00197e5e;
          }
          goto LAB_0019791f;
        }
        pcVar8 = (ptVar4->pos).fname;
        uVar10._0_4_ = (ptVar4->pos).lno;
        uVar10._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        ptVar4 = c2m_ctx->parse_ctx->curr_token;
        sVar2 = *(short *)ptVar4;
        if (sVar2 == 0x103) {
          local_38 = ptVar4->node;
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        }
        else {
          local_38 = new_node(c2m_ctx,N_IGNORE);
        }
        pnVar7 = new_node(c2m_ctx,N_LIST);
        if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x7b) {
          if (sVar2 != 0x103) goto LAB_00197e5e;
          pnVar7 = new_node(c2m_ctx,N_IGNORE);
LAB_00197e32:
          pnVar7 = new_node2(c2m_ctx,N_ENUM,local_38,pnVar7);
          goto LAB_00197b29;
        }
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        do {
          ptVar4 = c2m_ctx->parse_ctx->curr_token;
          if (*(short *)ptVar4 != 0x103) {
            if (ppVar3->record_level != 0) {
              return &err_struct;
            }
            pcVar8 = "identifier";
            goto LAB_00197cf7;
          }
          pnVar9 = ptVar4->node;
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3d) {
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            op2 = cond_expr(c2m_ctx,no_err_p);
            if (op2 == &err_struct) {
              return &err_struct;
            }
          }
          else {
            op2 = new_node(c2m_ctx,N_IGNORE);
          }
          pnVar9 = new_node2(c2m_ctx,N_ENUM_CONST,pnVar9,op2);
          op_append(c2m_ctx,pnVar7,pnVar9);
          sVar2 = *(short *)c2m_ctx->parse_ctx->curr_token;
          if (sVar2 != 0x2c) goto LAB_00197e05;
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        } while (*(short *)ppVar3->curr_token != 0x7d);
        sVar2 = *(short *)c2m_ctx->parse_ctx->curr_token;
LAB_00197e05:
        if (sVar2 == 0x7d) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          goto LAB_00197e32;
        }
LAB_00197cc6:
        if (ppVar3->record_level != 0) {
          return &err_struct;
        }
        iVar11 = 0x7d;
LAB_00197cec:
        pcVar8 = get_token_name(c2m_ctx,iVar11);
LAB_00197cf7:
        syntax_error(c2m_ctx,pcVar8);
        return &err_struct;
      }
LAB_0019791f:
      pcVar8 = (ptVar4->pos).fname;
      uVar10._0_4_ = (ptVar4->pos).lno;
      uVar10._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      ptVar4 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar4 == 0x103) {
        local_48 = ptVar4->node;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x7b) goto LAB_00197b7d;
        pnVar7 = new_node(c2m_ctx,N_IGNORE);
      }
      else {
        local_48 = new_node(c2m_ctx,N_IGNORE);
        if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x7b) {
LAB_00197e5e:
          return &err_struct;
        }
LAB_00197b7d:
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        if (*(short *)ppVar3->curr_token == 0x7d) {
LAB_00197bb7:
          pcVar12 = error;
          if (c2m_ctx->options->pedantic_p == 0) {
            pcVar12 = warning;
          }
          (*pcVar12)(c2m_ctx,pcVar8,uVar10,"empty struct/union");
          pnVar7 = new_node(c2m_ctx,N_LIST);
        }
        else {
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            goto LAB_00197bb7;
          }
          pnVar7 = struct_declaration_list(c2m_ctx,no_err_p);
          if (pnVar7 == &err_struct) {
            return &err_struct;
          }
        }
        if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x7d) goto LAB_00197cc6;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      }
      pnVar7 = new_node2(c2m_ctx,uVar1 == 0x134 ^ N_UNION,local_48,pnVar7);
      goto LAB_00197b29;
    case 299:
      pcVar8 = (ptVar4->pos).fname;
      uVar10._0_4_ = (ptVar4->pos).lno;
      uVar10._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_INT;
      break;
    case 300:
      pcVar8 = (ptVar4->pos).fname;
      uVar10._0_4_ = (ptVar4->pos).lno;
      uVar10._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_LONG;
      break;
    case 0x130:
      pcVar8 = (ptVar4->pos).fname;
      uVar10._0_4_ = (ptVar4->pos).lno;
      uVar10._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_SHORT;
      break;
    case 0x131:
      pcVar8 = (ptVar4->pos).fname;
      uVar10._0_4_ = (ptVar4->pos).lno;
      uVar10._4_4_ = (ptVar4->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_SIGNED;
      break;
    default:
      if (uVar1 == 0x139) {
        pcVar8 = (ptVar4->pos).fname;
        uVar10._0_4_ = (ptVar4->pos).lno;
        uVar10._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nc = N_UNSIGNED;
      }
      else {
        iVar11 = no_err_p;
        if (uVar1 != 0x13a) goto switchD_001977ea_caseD_127;
        pcVar8 = (ptVar4->pos).fname;
        uVar10._0_4_ = (ptVar4->pos).lno;
        uVar10._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nc = N_VOID;
      }
    }
  }
  pnVar7 = new_node(c2m_ctx,nc);
LAB_00197b29:
  p.lno = (int)uVar10;
  p.ln_pos = (int)((ulong)uVar10 >> 0x20);
  p.fname = pcVar8;
  add_pos(c2m_ctx,pnVar7,p);
  return pnVar7;
}

Assistant:

DA (type_spec) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op1, op2, op3, op4, r;
  int struct_p, id_p = FALSE;
  pos_t pos;

  if (MP (T_VOID, pos)) {
    r = new_pos_node (c2m_ctx, N_VOID, pos);
  } else if (MP (T_CHAR, pos)) {
    r = new_pos_node (c2m_ctx, N_CHAR, pos);
  } else if (MP (T_SHORT, pos)) {
    r = new_pos_node (c2m_ctx, N_SHORT, pos);
  } else if (MP (T_INT, pos)) {
    r = new_pos_node (c2m_ctx, N_INT, pos);
  } else if (MP (T_LONG, pos)) {
    r = new_pos_node (c2m_ctx, N_LONG, pos);
  } else if (MP (T_FLOAT, pos)) {
    r = new_pos_node (c2m_ctx, N_FLOAT, pos);
  } else if (MP (T_DOUBLE, pos)) {
    r = new_pos_node (c2m_ctx, N_DOUBLE, pos);
  } else if (MP (T_SIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_SIGNED, pos);
  } else if (MP (T_UNSIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_UNSIGNED, pos);
  } else if (MP (T_BOOL, pos)) {
    r = new_pos_node (c2m_ctx, N_BOOL, pos);
  } else if (MP (T_COMPLEX, pos)) {
    if (record_level == 0) error (c2m_ctx, pos, "complex numbers are not supported");
    return err_node;
  } else if (MP (T_ATOMIC, pos)) { /* atomic-type-specifier */
    PT ('(');
    P (type_name);
    PT (')');
    error (c2m_ctx, pos, "Atomic types are not supported");
  } else if ((struct_p = MP (T_STRUCT, pos)) || MP (T_UNION, pos)) {
    /* struct-or-union-specifier, struct-or-union */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    if (M ('{')) {
      if (!C ('}') && !M (';')) {
        P (struct_declaration_list);
      } else {
        (c2m_options->pedantic_p ? error : warning) (c2m_ctx, pos, "empty struct/union");
        r = new_node (c2m_ctx, N_LIST);
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      r = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, struct_p ? N_STRUCT : N_UNION, pos, op1, r);
  } else if (MP (T_ENUM, pos)) { /* enum-specifier */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    op2 = new_node (c2m_ctx, N_LIST);
    if (M ('{')) { /* enumerator-list */
      for (;;) {   /* enumerator */
        PTN (T_ID);
        op3 = r; /* enumeration-constant */
        if (!M ('=')) {
          op4 = new_node (c2m_ctx, N_IGNORE);
        } else {
          P (const_expr);
          op4 = r;
        }
        op_append (c2m_ctx, op2, new_node2 (c2m_ctx, N_ENUM_CONST, op3, op4));
        if (!M (',')) break;
        if (C ('}')) break;
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      op2 = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, N_ENUM, pos, op1, op2);
  } else if (arg == NULL) {
    P (typedef_name);
  } else {
    r = err_node;
  }
  return r;
}